

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::ipc::ClientImpl::~ClientImpl(ClientImpl *this)

{
  UnixSocket *in_RSI;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__ClientImpl_00409ac8;
  (this->super_EventListener)._vptr_EventListener = (_func_int **)&PTR__ClientImpl_00409b18;
  OnDisconnect(this,in_RSI);
  base::WeakPtrFactory<perfetto::ipc::Client>::~WeakPtrFactory(&this->weak_ptr_factory_);
  std::__cxx11::
  _List_base<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>,_std::allocator<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>
  ::_M_clear(&(this->queued_bindings_).
              super__List_base<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>,_std::allocator<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>
            );
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>,_std::_Select1st<std::pair<const_unsigned_int,_perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>_>
  ::~_Rb_tree(&(this->service_bindings_)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_perfetto::ipc::ClientImpl::QueuedRequest>,_std::_Select1st<std::pair<const_unsigned_long,_perfetto::ipc::ClientImpl::QueuedRequest>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::ipc::ClientImpl::QueuedRequest>_>_>
  ::~_Rb_tree(&(this->queued_requests_)._M_t);
  base::
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::~ScopedResource(&this->received_fd_);
  BufferedFrameDeserializer::~BufferedFrameDeserializer(&this->frame_deserializer_);
  std::unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
  ~unique_ptr(&this->sock_);
  return;
}

Assistant:

ClientImpl::~ClientImpl() {
  // Ensure we are not destroyed in the middle of invoking a reply.
  PERFETTO_DCHECK(!invoking_method_reply_);
  OnDisconnect(
      nullptr);  // The base::UnixSocket* ptr is not used in OnDisconnect().
}